

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O3

Maybe<capnp::InterfaceSchema> __thiscall
capnp::InterfaceSchema::findSuperclass(InterfaceSchema *this,uint64_t typeId,uint *counter)

{
  uint uVar1;
  RawBrandedSchema *pRVar2;
  uint *in_RCX;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::InterfaceSchema>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::InterfaceSchema>_2 extraout_RDX_00;
  ulong uVar4;
  uint64_t id;
  ulong uVar5;
  Maybe<capnp::InterfaceSchema> MVar6;
  Schema local_c8;
  Schema local_c0;
  Reader superclasses;
  Fault f;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  uint64_t *local_78;
  WirePointer *local_70;
  uint local_68;
  ushort local_64;
  int local_60;
  PointerReader local_58;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::InterfaceSchema>_2 aVar3;
  
  uVar1 = *in_RCX;
  *in_RCX = uVar1 + 1;
  superclasses.reader.segment = (SegmentReader *)CONCAT44(superclasses.reader.segment._4_4_,uVar1);
  superclasses.reader.capTable = (CapTableReader *)&MAX_SUPERCLASSES;
  superclasses.reader.ptr = " < ";
  superclasses.reader.elementCount = 4;
  superclasses.reader.step = 0;
  superclasses.reader.structDataSize._0_1_ = uVar1 < 0x40;
  if ((bool)(undefined1)superclasses.reader.structDataSize) {
    pRVar2 = *(RawBrandedSchema **)typeId;
    aVar3 = (anon_union_8_1_a8c68091_for_NullableValue<capnp::InterfaceSchema>_2)counter;
    if ((uint *)pRVar2->generic->id == counter) {
LAB_00194f1e:
      *(undefined1 *)&(this->super_Schema).raw = 1;
      this[1].super_Schema.raw = pRVar2;
    }
    else {
      superclasses.reader.ptr = (byte *)pRVar2->generic->encodedNode;
      superclasses.reader.segment = (SegmentReader *)0x0;
      superclasses.reader.capTable = (CapTableReader *)0x0;
      superclasses.reader.elementCount = 0x7fffffff;
      superclasses.reader.step = 0;
      _::PointerReader::getStruct((StructReader *)&f,(PointerReader *)&superclasses,(word *)0x0);
      local_58.pointer = local_70 + 4;
      local_58.nestingLimit = local_60;
      if (local_64 < 5) {
        f.exception._0_4_ = 0;
        f.exception._4_4_ = 0;
        uStack_80 = 0;
        uStack_7c = 0;
        local_58.nestingLimit = 0x7fffffff;
        local_58.pointer = (WirePointer *)0x0;
      }
      local_58.segment._0_4_ = f.exception._0_4_;
      local_58.segment._4_4_ = f.exception._4_4_;
      local_58.capTable._0_4_ = uStack_80;
      local_58.capTable._4_4_ = uStack_7c;
      _::PointerReader::getList(&superclasses.reader,&local_58,INLINE_COMPOSITE,(word *)0x0);
      uVar4 = superclasses.reader._24_8_ & 0xffffffff;
      aVar3 = extraout_RDX_00;
      if (uVar4 != 0) {
        uVar5 = 0;
        do {
          _::ListReader::getStructElement
                    ((StructReader *)&f,&superclasses.reader,(ElementCount)uVar5);
          if (local_68 < 0x40) {
            id = 0;
          }
          else {
            id = *local_78;
          }
          local_c8 = Schema::getDependency((Schema *)typeId,id,(ElementCount)uVar5 | 0x4000000);
          local_c0.raw = (RawBrandedSchema *)Schema::asInterface(&local_c8);
          MVar6 = findSuperclass((InterfaceSchema *)&local_58,(uint64_t)&local_c0,counter);
          aVar3 = MVar6.ptr.field_1;
          if ((char)local_58.segment == '\x01') {
            pRVar2 = (RawBrandedSchema *)CONCAT44(local_58.capTable._4_4_,local_58.capTable._0_4_);
            goto LAB_00194f1e;
          }
          uVar5 = uVar5 + 1;
        } while (uVar4 != uVar5);
      }
      *(undefined1 *)&(this->super_Schema).raw = 0;
    }
  }
  else {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int_const&>&,char_const(&)[53]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema.c++"
               ,0x2a0,FAILED,"counter++ < MAX_SUPERCLASSES",
               "_kjCondition,\"Cyclic or absurdly-large inheritance graph detected.\"",
               (DebugComparison<unsigned_int,_const_unsigned_int_&> *)&superclasses,
               (char (*) [53])"Cyclic or absurdly-large inheritance graph detected.");
    *(undefined1 *)&(this->super_Schema).raw = 0;
    kj::_::Debug::Fault::~Fault(&f);
    aVar3 = extraout_RDX;
  }
  MVar6.ptr.field_1 = aVar3;
  MVar6.ptr._0_8_ = this;
  return (Maybe<capnp::InterfaceSchema>)MVar6.ptr;
}

Assistant:

kj::Maybe<InterfaceSchema> InterfaceSchema::findSuperclass(uint64_t typeId, uint& counter) const {
  // Security:  Don't let someone DOS us with a dynamic schema containing cyclic inheritance.
  KJ_REQUIRE(counter++ < MAX_SUPERCLASSES, "Cyclic or absurdly-large inheritance graph detected.") {
    return kj::none;
  }

  if (typeId == raw->generic->id) {
    return *this;
  }

  // TODO(perf):  This may be somewhat slow.  See findMethodByName() for discussion.
  auto superclasses = getProto().getInterface().getSuperclasses();
  for (auto i: kj::indices(superclasses)) {
    auto superclass = superclasses[i];
    uint location = _::RawBrandedSchema::makeDepLocation(
        _::RawBrandedSchema::DepKind::SUPERCLASS, i);
    KJ_IF_SOME(result, getDependency(superclass.getId(), location).asInterface()
                            .findSuperclass(typeId, counter)) {
      return result;
    }
  }

  return kj::none;
}